

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool google::protobuf::util::FieldMaskUtil::ToJsonString(FieldMask *mask,string *out)

{
  size_type *psVar1;
  FieldMaskUtil *this;
  char *size;
  bool bVar2;
  Type *pTVar3;
  string *in_RCX;
  int index;
  StringPiece input;
  size_type *local_58;
  string camelcase_path;
  
  out->_M_string_length = 0;
  *(out->_M_dataplus)._M_p = '\0';
  if (0 < (mask->paths_).super_RepeatedPtrFieldBase.current_size_) {
    index = 0;
    psVar1 = &camelcase_path._M_string_length;
    camelcase_path.field_2._8_8_ = out;
    do {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(mask->paths_).super_RepeatedPtrFieldBase,index);
      camelcase_path._M_dataplus._M_p = (pointer)0x0;
      camelcase_path._M_string_length._0_1_ = 0;
      this = (FieldMaskUtil *)(pTVar3->_M_dataplus)._M_p;
      size = (char *)pTVar3->_M_string_length;
      local_58 = psVar1;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      input.length_ = (stringpiece_ssize_type)&local_58;
      input.ptr_ = size;
      bVar2 = SnakeCaseToCamelCase(this,input,in_RCX);
      if (!bVar2) {
        if (local_58 != psVar1) {
          operator_delete(local_58);
        }
        return false;
      }
      if (index != 0) {
        std::__cxx11::string::push_back((char)camelcase_path.field_2._8_8_);
      }
      std::__cxx11::string::_M_append((char *)camelcase_path.field_2._8_8_,(ulong)local_58);
      if (local_58 != psVar1) {
        operator_delete(local_58);
      }
      index = index + 1;
    } while (index < (mask->paths_).super_RepeatedPtrFieldBase.current_size_);
  }
  return true;
}

Assistant:

bool FieldMaskUtil::ToJsonString(const FieldMask& mask, std::string* out) {
  out->clear();
  for (int i = 0; i < mask.paths_size(); ++i) {
    const std::string& path = mask.paths(i);
    std::string camelcase_path;
    if (!SnakeCaseToCamelCase(path, &camelcase_path)) {
      return false;
    }
    if (i > 0) {
      out->push_back(',');
    }
    out->append(camelcase_path);
  }
  return true;
}